

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O2

_Bool container_contains_range
                (container_t *c,uint32_t range_start,uint32_t range_end,uint8_t typecode)

{
  long lVar1;
  ushort uVar2;
  ushort uVar3;
  long lVar4;
  bool bVar5;
  int32_t iVar6;
  ulong uVar7;
  undefined7 in_register_00000009;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  int iVar13;
  
  uVar10 = (uint)CONCAT71(in_register_00000009,typecode);
  if (uVar10 == 4) {
    uVar10 = (uint)*(byte *)((long)c + 8);
    c = *c;
  }
  if ((char)uVar10 == '\x03') {
    uVar10 = interleavedBinarySearch(*(rle16_t **)((long)c + 8),*c,(uint16_t)range_start);
    uVar8 = (ulong)uVar10;
    if ((-1 < (int)uVar10) ||
       ((uVar10 != 0xffffffff &&
        (uVar8 = (ulong)(-uVar10 - 2),
        range_start - *(ushort *)(*(long *)((long)c + 8) + uVar8 * 4) <=
        (uint)*(ushort *)(*(long *)((long)c + 8) + 2 + uVar8 * 4))))) {
      uVar10 = 0;
      do {
        if ((long)*c <= (long)uVar8) {
LAB_001084d5:
          return ~range_start + range_end <= uVar10;
        }
        uVar2 = *(ushort *)(*(long *)((long)c + 8) + uVar8 * 4);
        if (range_end <= uVar2) goto LAB_001084d5;
        uVar3 = *(ushort *)(*(long *)((long)c + 8) + 2 + uVar8 * 4);
        if (range_end <= (uint)uVar3 + (uint)uVar2) {
          uVar10 = (uVar10 + range_end) - (uint)uVar2;
          goto LAB_001084d5;
        }
        uVar12 = ((uint)uVar3 + (uint)uVar2) - range_start;
        if (uVar3 <= uVar12) {
          uVar12 = (uint)uVar3;
        }
        uVar10 = uVar10 + uVar12;
        uVar8 = uVar8 + 1;
      } while( true );
    }
  }
  else if ((uVar10 & 0xff) == 2) {
    iVar13 = range_end - range_start;
    if (iVar13 == 0 || (int)range_end < (int)range_start) {
      return true;
    }
    if (((iVar13 <= *c) &&
        (iVar6 = binarySearch(*(uint16_t **)((long)c + 8),*c,(uint16_t)range_start), -1 < iVar6)) &&
       (iVar6 + iVar13 <= *c)) {
      return *(short *)(*(long *)((long)c + 8) + -2 + (ulong)(uint)(iVar6 + iVar13) * 2) ==
             (short)((short)range_end + -1);
    }
  }
  else {
    uVar9 = (ulong)(range_start >> 6);
    uVar11 = -1L << ((byte)range_start & 0x3f);
    uVar7 = -1L << ((byte)range_end & 0x3f);
    uVar10 = range_end >> 6;
    lVar4 = *(long *)((long)c + 8);
    uVar8 = *(ulong *)(lVar4 + uVar9 * 8);
    if (range_start >> 6 == uVar10) {
      return (uVar11 & ~(uVar8 | uVar7)) == 0;
    }
    if ((uVar11 <= uVar8) &&
       ((0xffff < range_end ||
        ((uVar7 | *(ulong *)(lVar4 + (ulong)uVar10 * 8)) == 0xffffffffffffffff)))) {
      do {
        bVar5 = (ulong)uVar10 <= uVar9 + 1 || 0x3fe < uVar9;
        if (bVar5) {
          return bVar5;
        }
        lVar1 = uVar9 * 8;
        uVar9 = uVar9 + 1;
      } while (*(long *)(lVar4 + 8 + lVar1) == -1);
      return bVar5;
    }
  }
  return false;
}

Assistant:

static inline bool container_contains_range(
    const container_t *c, uint32_t range_start, uint32_t range_end,
    uint8_t typecode  // !!! should be second argument?
) {
    c = container_unwrap_shared(c, &typecode);
    switch (typecode) {
        case BITSET_CONTAINER_TYPE:
            return bitset_container_get_range(const_CAST_bitset(c), range_start,
                                              range_end);
        case ARRAY_CONTAINER_TYPE:
            return array_container_contains_range(const_CAST_array(c),
                                                  range_start, range_end);
        case RUN_CONTAINER_TYPE:
            return run_container_contains_range(const_CAST_run(c), range_start,
                                                range_end);
        default:
            assert(false);
            roaring_unreachable;
            return false;
    }
}